

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O2

void __thiscall ktx::PrintIndent::operator()(PrintIndent *this,int depth,char (*fmt) [3])

{
  v10 *this_00;
  char *pcVar1;
  char *pcVar2;
  int *in_R9;
  format_string<const_char_(&)[1],_int> fmt_00;
  format_string<> fmt_01;
  char local_14 [4];
  
  fmt_00.str_.size_ = (size_t)"";
  fmt_00.str_.data_ = (char *)0x5;
  pcVar2 = "";
  ::fmt::v10::print<char_const(&)[1],int>
            ((v10 *)this->os,(ostream *)"{:{}}",fmt_00,(char (*) [1])local_14,in_R9);
  this_00 = (v10 *)this->os;
  pcVar1 = (char *)strlen(*fmt);
  fmt_01.str_.size_ = (size_t)pcVar2;
  fmt_01.str_.data_ = pcVar1;
  ::fmt::v10::print<>(this_00,(ostream *)fmt,fmt_01);
  return;
}

Assistant:

inline void operator()(int depth, Fmt&& fmt, Args&&... args) {
        fmt::print(os, "{:{}}", "", indentWidth * (indentBase + depth));
        fmt::print(os, std::forward<Fmt>(fmt), std::forward<Args>(args)...);
    }